

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrsolv.c
# Opt level: O2

void qrsolv(int n,double *r,int ldr,int *ipvt,double *diag,double *qtb,double *x,double *sdiag,
           double *wa)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double *local_a0;
  int local_94;
  
  lVar8 = (long)ldr;
  uVar3 = 0;
  uVar10 = 0;
  if (0 < n) {
    uVar10 = (ulong)(uint)n;
  }
  uVar12 = (ulong)(uint)n;
  pdVar4 = r;
  uVar13 = uVar12;
  for (; uVar3 != uVar10; uVar3 = uVar3 + 1) {
    lVar7 = 0;
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      pdVar4[uVar9] = pdVar4[lVar7];
      lVar7 = lVar7 + lVar8;
    }
    x[uVar3] = r[(ldr + 1) * (int)uVar3];
    wa[uVar3] = qtb[uVar3];
    pdVar4 = pdVar4 + lVar8 + 1;
    uVar13 = uVar13 - 1;
  }
  local_94 = 1;
  pdVar4 = sdiag;
  uVar3 = uVar12;
  for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
    iVar11 = ipvt[uVar13];
    if ((diag[(long)iVar11 + -1] != 0.0) || (NAN(diag[(long)iVar11 + -1]))) {
      for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
        pdVar4[uVar9] = 0.0;
      }
      sdiag[uVar13] = diag[(long)iVar11 + -1];
      dVar16 = 0.0;
      iVar11 = local_94;
      for (uVar9 = uVar13; uVar9 != uVar12; uVar9 = uVar9 + 1) {
        dVar14 = sdiag[uVar9];
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          lVar7 = uVar9 * lVar8;
          dVar17 = r[lVar7 + uVar9];
          if (ABS(dVar14) <= ABS(dVar17)) {
            dVar14 = dVar14 / dVar17;
            dVar17 = dVar14 * dVar14 * 0.25 + 0.25;
            if (dVar17 < 0.0) {
              dVar17 = sqrt(dVar17);
            }
            else {
              dVar17 = SQRT(dVar17);
            }
            dVar17 = 0.5 / dVar17;
            dVar14 = dVar14 * dVar17;
          }
          else {
            dVar17 = dVar17 / dVar14;
            dVar14 = dVar17 * dVar17 * 0.25 + 0.25;
            if (dVar14 < 0.0) {
              dVar14 = sqrt(dVar14);
            }
            else {
              dVar14 = SQRT(dVar14);
            }
            dVar14 = 0.5 / dVar14;
            dVar17 = dVar17 * dVar14;
          }
          dVar15 = dVar16 * dVar14;
          dVar16 = dVar16 * dVar17 - wa[uVar9] * dVar14;
          wa[uVar9] = dVar17 * wa[uVar9] + dVar15;
          r[lVar7 + uVar9] = r[lVar7 + uVar9] * dVar17 + sdiag[uVar9] * dVar14;
          if ((long)(uVar9 + 1) < (long)n) {
            for (lVar5 = (long)iVar11; lVar5 < n; lVar5 = lVar5 + 1) {
              dVar15 = r[lVar7 + lVar5];
              dVar1 = sdiag[lVar5];
              sdiag[lVar5] = dVar15 * -dVar14 + dVar1 * dVar17;
              r[lVar7 + lVar5] = dVar17 * dVar15 + dVar14 * dVar1;
            }
          }
        }
        iVar11 = iVar11 + 1;
      }
    }
    iVar11 = (ldr + 1) * (int)uVar13;
    sdiag[uVar13] = r[iVar11];
    r[iVar11] = x[uVar13];
    local_94 = local_94 + 1;
    uVar3 = uVar3 - 1;
    pdVar4 = pdVar4 + 1;
  }
  uVar2 = n;
  for (uVar3 = 0; uVar10 != uVar3; uVar3 = uVar3 + 1) {
    uVar6 = (uint)uVar3;
    if (sdiag[uVar3] != 0.0) {
      uVar6 = uVar2;
    }
    if (NAN(sdiag[uVar3])) {
      uVar6 = uVar2;
    }
    if (uVar2 == n) {
      uVar2 = uVar6;
    }
    if ((int)uVar2 < n) {
      wa[uVar3] = 0.0;
    }
  }
  if (0 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
    uVar6 = uVar2 + 1;
    local_a0 = (double *)((long)r + lVar8 * 8 * (uVar13 - 1));
    for (uVar3 = 1; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      lVar7 = uVar13 - uVar3;
      dVar16 = 0.0;
      if (lVar7 < (long)(uVar13 - 1)) {
        for (lVar5 = (long)(int)uVar2; lVar5 < (long)uVar13; lVar5 = lVar5 + 1) {
          dVar16 = dVar16 + local_a0[lVar5] * wa[lVar5];
        }
      }
      wa[lVar7] = (wa[lVar7] - dVar16) / sdiag[lVar7];
      uVar2 = uVar2 - 1;
      local_a0 = local_a0 + -lVar8;
    }
  }
  for (uVar3 = 0; uVar10 != uVar3; uVar3 = uVar3 + 1) {
    x[(long)ipvt[uVar3] + -1] = wa[uVar3];
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(qrsolv)(int n, real *r, int ldr, 
	const int *ipvt, const real *diag, const real *qtb, real *x, 
	real *sdiag, real *wa)
{
    /* Initialized data */

#define p5 ((real).5)
#define p25 ((real).25)

    /* Local variables */
    int i, j, k, l;
    real cos, sin, sum, temp;
    int nsing;
    real qtbpj;

/*     ********** */

/*     subroutine qrsolv */

/*     given an m by n matrix a, an n by n diagonal matrix d, */
/*     and an m-vector b, the problem is to determine an x which */
/*     solves the system */

/*           a*x = b ,     d*x = 0 , */

/*     in the least squares sense. */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization, with column pivoting, of a. that is, if */
/*     a*p = q*r, where p is a permutation matrix, q has orthogonal */
/*     columns, and r is an upper triangular matrix with diagonal */
/*     elements of nonincreasing magnitude, then qrsolv expects */
/*     the full upper triangle of r, the permutation matrix p, */
/*     and the first n components of (q transpose)*b. the system */
/*     a*x = b, d*x = 0, is then equivalent to */

/*                  t       t */
/*           r*z = q *b ,  p *d*p*z = 0 , */

/*     where x = p*z. if this system does not have full rank, */
/*     then a least squares solution is obtained. on output qrsolv */
/*     also provides an upper triangular matrix s such that */

/*            t   t               t */
/*           p *(a *a + d*d)*p = s *s . */

/*     s is computed within qrsolv and may be of separate interest. */

/*     the subroutine statement is */

/*       subroutine qrsolv(n,r,ldr,ipvt,diag,qtb,x,sdiag,wa) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an n by n array. on input the full upper triangle */
/*         must contain the full upper triangle of the matrix r. */
/*         on output the full upper triangle is unaltered, and the */
/*         strict lower triangle contains the strict upper triangle */
/*         (transposed) of the upper triangular matrix s. */

/*       ldr is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array r. */

/*       ipvt is an integer input array of length n which defines the */
/*         permutation matrix p such that a*p = q*r. column j of p */
/*         is column ipvt(j) of the identity matrix. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       x is an output array of length n which contains the least */
/*         squares solution of the system a*x = b, d*x = 0. */

/*       sdiag is an output array of length n which contains the */
/*         diagonal elements of the upper triangular matrix s. */

/*       wa is a work array of length n. */

/*     subprograms called */

/*       fortran-supplied ... dabs,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

/*     copy r and (q transpose)*b to preserve input and initialize s. */
/*     in particular, save the diagonal elements of r in x. */

    for (j = 0; j < n; ++j) {
	for (i = j; i < n; ++i) {
	    r[i + j * ldr] = r[j + i * ldr];
	}
	x[j] = r[j + j * ldr];
	wa[j] = qtb[j];
    }

/*     eliminate the diagonal matrix d using a givens rotation. */

    for (j = 0; j < n; ++j) {

/*        prepare the row of d to be eliminated, locating the */
/*        diagonal element using p from the qr factorization. */

	l = ipvt[j]-1;
	if (diag[l] != 0.) {
            for (k = j; k < n; ++k) {
                sdiag[k] = 0.;
            }
            sdiag[j] = diag[l];

/*        the transformations to eliminate the row of d */
/*        modify only a single element of (q transpose)*b */
/*        beyond the first n, which is initially zero. */

            qtbpj = 0.;
            for (k = j; k < n; ++k) {

/*           determine a givens rotation which eliminates the */
/*           appropriate element in the current row of d. */

                if (sdiag[k] != 0.) {
#                 ifdef USE_LAPACK
                    __cminpack_lapack__(lartg_)( &r[k + k * ldr], &sdiag[k], &cos, &sin, &temp );
#                 else /* !USE_LAPACK */
                    if (fabs(r[k + k * ldr]) < fabs(sdiag[k])) {
                        real cotan;
                        cotan = r[k + k * ldr] / sdiag[k];
                        sin = p5 / sqrt(p25 + p25 * (cotan * cotan));
                        cos = sin * cotan;
                    } else {
                        real tan;
                        tan = sdiag[k] / r[k + k * ldr];
                        cos = p5 / sqrt(p25 + p25 * (tan * tan));
                        sin = cos * tan;
                    }

/*           compute the modified diagonal element of r and */
/*           the modified element of ((q transpose)*b,0). */

#                 endif /* !USE_LAPACK */
                    temp = cos * wa[k] + sin * qtbpj;
                    qtbpj = -sin * wa[k] + cos * qtbpj;
                    wa[k] = temp;

/*           accumulate the tranformation in the row of s. */
#                 ifdef USE_BLAS
                    const __cminpack_blasint__ n_minus_k = n - k;
                    const __cminpack_blasint__ c__1 = 1;
                    
                    __cminpack_blas__(rot)(&n_minus_k, &r[k + k * ldr], &c__1, &sdiag[k], &c__1, &cos, &sin);
#                 else /* !USE_BLAS */
                    r[k + k * ldr] = cos * r[k + k * ldr] + sin * sdiag[k];
                    if (n > k+1) {
                        for (i = k+1; i < n; ++i) {
                            temp = cos * r[i + k * ldr] + sin * sdiag[i];
                            sdiag[i] = -sin * r[i + k * ldr] + cos * sdiag[i];
                            r[i + k * ldr] = temp;
                        }
                    }
#                 endif /* !USE_BLAS */
                }
            }
        }

/*        store the diagonal element of s and restore */
/*        the corresponding diagonal element of r. */

	sdiag[j] = r[j + j * ldr];
	r[j + j * ldr] = x[j];
    }

/*     solve the triangular system for z. if the system is */
/*     singular, then obtain a least squares solution. */

    nsing = n;
    for (j = 0; j < n; ++j) {
	if (sdiag[j] == 0. && nsing == n) {
	    nsing = j;
	}
	if (nsing < n) {
	    wa[j] = 0.;
	}
    }
    if (nsing >= 1) {
        for (k = 1; k <= nsing; ++k) {
            j = nsing - k;
            sum = 0.;
            if (nsing > j+1) {
                for (i = j+1; i < nsing; ++i) {
                    sum += r[i + j * ldr] * wa[i];
                }
            }
            wa[j] = (wa[j] - sum) / sdiag[j];
        }
    }

/*     permute the components of z back to components of x. */

    for (j = 0; j < n; ++j) {
	l = ipvt[j]-1;
	x[l] = wa[j];
    }
    return;

/*     last card of subroutine qrsolv. */

}